

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_25095d::PointerType::printRight(PointerType *this,OutputStream *s)

{
  bool bVar1;
  ObjCProtoName *this_00;
  StringView R;
  
  this_00 = (ObjCProtoName *)this->Pointee;
  if ((this_00->super_Node).K == KObjCProtoName) {
    bVar1 = ObjCProtoName::isObjCObject(this_00);
    if (bVar1) {
      return;
    }
    this_00 = (ObjCProtoName *)this->Pointee;
  }
  bVar1 = Node::hasArray(&this_00->super_Node,s);
  if (!bVar1) {
    bVar1 = Node::hasFunction(this->Pointee,s);
    if (!bVar1) goto LAB_0017cff3;
  }
  R.Last = "";
  R.First = ")";
  OutputStream::operator+=(s,R);
LAB_0017cff3:
  (*this->Pointee->_vptr_Node[5])(this->Pointee,s);
  return;
}

Assistant:

void printRight(OutputStream &s) const override {
    if (Pointee->getKind() != KObjCProtoName ||
        !static_cast<const ObjCProtoName *>(Pointee)->isObjCObject()) {
      if (Pointee->hasArray(s) || Pointee->hasFunction(s))
        s += ")";
      Pointee->printRight(s);
    }
  }